

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O1

_Bool rsa2_verify(ssh_key *key,ptrlen sig,ptrlen data)

{
  byte bVar1;
  uint uVar2;
  _Bool _Var3;
  byte bVar4;
  size_t sVar5;
  long lVar6;
  mp_int *base;
  mp_int *x;
  uchar *b;
  byte bVar7;
  ssh_hashalg *halg;
  ulong uVar8;
  ulong nbytes;
  ptrlen pl;
  ptrlen bytes;
  BinarySource src [1];
  BinarySource local_58;
  
  uVar2 = *key->vt->extra;
  if ((uVar2 & 4) == 0) {
    halg = &ssh_sha1;
  }
  else {
    halg = &ssh_sha512;
  }
  if ((uVar2 & 2) != 0) {
    halg = &ssh_sha256;
  }
  sVar5 = mp_get_nbits((mp_int *)key[-7].vt);
  if ((uVar2 & 6) == 0) {
    lVar6 = 0x12;
  }
  else {
    lVar6 = 0x16;
    if (halg != &ssh_sha512 && (char)((uVar2 & 2) >> 1) == '\0') {
      __assert_fail("false && \"bad hash algorithm for RSA PKCS#1\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/rsa.c"
                    ,0x2ca,"ptrlen rsa_pkcs1_prefix_for_hash(const ssh_hashalg *)");
    }
  }
  nbytes = sVar5 + 7 >> 3;
  if (lVar6 + halg->hlen <= nbytes) {
    local_58.binarysource_ = &local_58;
    local_58.pos = 0;
    local_58.err = BSE_NO_ERROR;
    local_58.data = sig.ptr;
    local_58.len = sig.len;
    pl = BinarySource_get_string(local_58.binarysource_);
    bytes = BinarySource_get_string(local_58.binarysource_);
    if (((local_58.binarysource_)->err == BSE_NO_ERROR) &&
       (_Var3 = ptrlen_eq_string(pl,key->vt->ssh_id), _Var3)) {
      base = mp_from_bytes_be(bytes);
      x = mp_modpow(base,(mp_int *)key[-6].vt,(mp_int *)key[-7].vt);
      mp_free(base);
      b = rsa_pkcs1_signature_string(nbytes,halg,data);
      _Var3 = true;
      if (7 < sVar5 + 7) {
        sVar5 = 0;
        bVar7 = 0;
        uVar8 = nbytes;
        do {
          bVar1 = b[uVar8 - 1];
          bVar4 = mp_get_byte(x,sVar5);
          bVar7 = bVar7 | bVar4 ^ bVar1;
          sVar5 = sVar5 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
        _Var3 = bVar7 == 0;
      }
      smemclr(b,nbytes);
      safefree(b);
      mp_free(x);
      return _Var3;
    }
  }
  return false;
}

Assistant:

static bool rsa2_verify(ssh_key *key, ptrlen sig, ptrlen data)
{
    RSAKey *rsa = container_of(key, RSAKey, sshk);
    BinarySource src[1];
    ptrlen type, in_pl;
    mp_int *in, *out;

    const struct ssh2_rsa_extra *extra =
        (const struct ssh2_rsa_extra *)key->vt->extra;

    const ssh_hashalg *halg = rsa2_hash_alg_for_flags(extra->signflags, NULL);

    /* Start by making sure the key is even long enough to encode a
     * signature. If not, everything fails to verify. */
    size_t nbytes = (mp_get_nbits(rsa->modulus) + 7) / 8;
    if (nbytes < rsa_pkcs1_length_of_fixed_parts(halg))
        return false;

    BinarySource_BARE_INIT_PL(src, sig);
    type = get_string(src);
    /*
     * RFC 4253 section 6.6: the signature integer in an ssh-rsa
     * signature is 'without lengths or padding'. That is, we _don't_
     * expect the usual leading zero byte if the topmost bit of the
     * first byte is set. (However, because of the possibility of
     * BUG_SSH2_RSA_PADDING at the other end, we tolerate it if it's
     * there.) So we can't use get_mp_ssh2, which enforces that
     * leading-byte scheme; instead we use get_string and
     * mp_from_bytes_be, which will tolerate anything.
     */
    in_pl = get_string(src);
    if (get_err(src) || !ptrlen_eq_string(type, key->vt->ssh_id))
        return false;

    in = mp_from_bytes_be(in_pl);
    out = mp_modpow(in, rsa->exponent, rsa->modulus);
    mp_free(in);

    unsigned diff = 0;

    unsigned char *bytes = rsa_pkcs1_signature_string(nbytes, halg, data);
    for (size_t i = 0; i < nbytes; i++)
        diff |= bytes[nbytes-1 - i] ^ mp_get_byte(out, i);
    smemclr(bytes, nbytes);
    sfree(bytes);
    mp_free(out);

    return diff == 0;
}